

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> * __thiscall
cmCTest::Private::GetTestingHandlers
          (vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
           *__return_storage_ptr__,Private *this)

{
  initializer_list<cmCTestGenericHandler_*> __l;
  allocator<cmCTestGenericHandler_*> local_79;
  cmCTestGenericHandler *local_78;
  cmCTestBuildAndTestHandler *local_70;
  cmCTestCoverageHandler *local_68;
  cmCTestScriptHandler *local_60;
  cmCTestTestHandler *local_58;
  cmCTestUpdateHandler *local_50;
  cmCTestConfigureHandler *local_48;
  cmCTestMemCheckHandler *local_40;
  cmCTestSubmitHandler *local_38;
  cmCTestUploadHandler *local_30;
  iterator local_28;
  size_type local_20;
  Private *local_18;
  Private *this_local;
  
  local_78 = &(this->BuildHandler).super_cmCTestGenericHandler;
  local_70 = &this->BuildAndTestHandler;
  local_68 = &this->CoverageHandler;
  local_60 = &this->ScriptHandler;
  local_58 = &this->TestHandler;
  local_50 = &this->UpdateHandler;
  local_48 = &this->ConfigureHandler;
  local_40 = &this->MemCheckHandler;
  local_38 = &this->SubmitHandler;
  local_30 = &this->UploadHandler;
  local_28 = &local_78;
  local_20 = 10;
  local_18 = this;
  this_local = (Private *)__return_storage_ptr__;
  std::allocator<cmCTestGenericHandler_*>::allocator(&local_79);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::vector
            (__return_storage_ptr__,__l,&local_79);
  std::allocator<cmCTestGenericHandler_*>::~allocator(&local_79);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmCTestGenericHandler*> GetTestingHandlers()
  {
    return { &this->BuildHandler,     &this->BuildAndTestHandler,
             &this->CoverageHandler,  &this->ScriptHandler,
             &this->TestHandler,      &this->UpdateHandler,
             &this->ConfigureHandler, &this->MemCheckHandler,
             &this->SubmitHandler,    &this->UploadHandler };
  }